

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Filter(Relation *this,string *expression)

{
  ParserOptions options;
  ClientContext *this_00;
  reference pvVar1;
  ParserException *this_01;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::Relation,_true> sVar2;
  allocator local_81;
  ParsedExpression *local_80;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  expression_list;
  string local_60;
  ParserOptions local_40;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&expression->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)&local_60);
  this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                      ((shared_ptr<duckdb::ClientContext,_true> *)&local_60);
  ClientContext::GetParserOptions(&local_40,this_00);
  options.max_expression_depth = local_40.max_expression_depth;
  options.preserve_identifier_case = local_40.preserve_identifier_case;
  options.integer_division = local_40.integer_division;
  options._2_6_ = local_40._2_6_;
  options.extensions = local_40.extensions;
  Parser::ParseExpressionList(&expression_list,in_RDX,options);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_string_length);
  if ((long)expression_list.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)expression_list.
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&expression_list,0);
    local_80 = (pvVar1->
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pvVar1->
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)._M_t
    .super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    Filter(this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 *)expression);
    if (local_80 != (ParsedExpression *)0x0) {
      (**(code **)((long)(local_80->super_BaseExpression)._vptr_BaseExpression + 8))();
    }
    local_80 = (ParsedExpression *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&expression_list.
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             );
    sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_01 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_60,"Expected a single expression as filter condition",&local_81);
  ParserException::ParserException(this_01,&local_60);
  __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Relation::Filter(const string &expression) {
	auto expression_list = Parser::ParseExpressionList(expression, context->GetContext()->GetParserOptions());
	if (expression_list.size() != 1) {
		throw ParserException("Expected a single expression as filter condition");
	}
	return Filter(std::move(expression_list[0]));
}